

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLDateTime::searchMiliSeconds
          (XMLDateTime *this,XMLCh **miliStartPtr,XMLCh **miliEndPtr)

{
  int iVar1;
  XMLCh *pXVar2;
  XMLCh *pXVar3;
  
  *miliEndPtr = (XMLCh *)0x0;
  *miliStartPtr = (XMLCh *)0x0;
  iVar1 = XMLString::indexOf(this->fBuffer,L'.');
  if (iVar1 != -1) {
    pXVar3 = this->fBuffer;
    *miliStartPtr = pXVar3 + (long)iVar1 + 1;
    pXVar3 = pXVar3 + iVar1;
    do {
      pXVar2 = pXVar3;
      pXVar3 = pXVar2 + 1;
    } while (0xfff5 < (ushort)(pXVar2[1] + L'ￆ'));
    *miliEndPtr = pXVar3;
    if (*pXVar2 == L'0') {
      do {
        pXVar2 = pXVar3 + -2;
        pXVar3 = pXVar3 + -1;
      } while (*pXVar2 == L'0');
      *miliEndPtr = pXVar3;
    }
  }
  return;
}

Assistant:

void XMLDateTime::searchMiliSeconds(XMLCh*& miliStartPtr, XMLCh*& miliEndPtr) const
{
    miliStartPtr = miliEndPtr = 0;

    int milisec = XMLString::indexOf(fBuffer, MILISECOND_SEPARATOR);
    if (milisec == -1)
        return;

    miliStartPtr = fBuffer + milisec + 1;
    miliEndPtr   = miliStartPtr;
    while (*miliEndPtr)
    {
        if ((*miliEndPtr < chDigit_0) || (*miliEndPtr > chDigit_9))
            break;

        miliEndPtr++;
    }

    //remove trailing zeros
    while( *(miliEndPtr - 1) == chDigit_0)
        miliEndPtr--;

    return;
}